

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packing.cpp
# Opt level: O1

int __thiscall ncnn::Packing::forward(Packing *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  uint _w;
  uint _h;
  uint _d;
  uint uVar2;
  int *piVar3;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  void *pvVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  size_t sVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  ulong local_a8;
  ulong local_58;
  
  iVar1 = bottom_blob->elempack;
  uVar15 = (ulong)iVar1;
  iVar10 = this->out_elempack;
  uVar17 = (ulong)iVar10;
  if (iVar1 != iVar10) {
    _w = bottom_blob->w;
    lVar20 = (long)(int)_w;
    _h = bottom_blob->h;
    uVar8 = (ulong)_h;
    _d = bottom_blob->d;
    iVar14 = bottom_blob->c;
    iVar13 = bottom_blob->dims;
    uVar4 = bottom_blob->elemsize;
    if ((this->use_padding != 0) ||
       ((((uVar2 = _h, iVar13 != 2 && (uVar2 = _w, iVar13 != 1)) ||
         ((int)(uVar2 * iVar1) % iVar10 == 0)) &&
        ((1 < iVar13 - 3U || ((iVar14 * iVar1) % iVar10 == 0)))))) {
      switch(iVar13) {
      case 1:
        if (iVar10 == 1) {
          if (top_blob != bottom_blob) {
            piVar3 = bottom_blob->refcount;
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + 1;
              UNLOCK();
            }
            piVar3 = top_blob->refcount;
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  if (top_blob->data != (void *)0x0) {
                    free(top_blob->data);
                  }
                }
                else {
                  (*top_blob->allocator->_vptr_Allocator[3])();
                }
              }
            }
            top_blob->cstep = 0;
            top_blob->data = (void *)0x0;
            top_blob->refcount = (int *)0x0;
            *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
            *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
            top_blob->dims = 0;
            top_blob->w = 0;
            top_blob->h = 0;
            top_blob->d = 0;
            top_blob->c = 0;
            piVar3 = bottom_blob->refcount;
            top_blob->data = bottom_blob->data;
            top_blob->refcount = piVar3;
            top_blob->elemsize = bottom_blob->elemsize;
            top_blob->elempack = bottom_blob->elempack;
            top_blob->allocator = bottom_blob->allocator;
            iVar10 = bottom_blob->w;
            iVar14 = bottom_blob->h;
            iVar13 = bottom_blob->d;
            top_blob->dims = bottom_blob->dims;
            top_blob->w = iVar10;
            top_blob->h = iVar14;
            top_blob->d = iVar13;
            top_blob->c = bottom_blob->c;
            top_blob->cstep = bottom_blob->cstep;
          }
          top_blob->w = iVar1 * _w;
          top_blob->cstep = lVar20 * uVar15;
          top_blob->elemsize = uVar4 / uVar15;
          top_blob->elempack = this->out_elempack;
          return 0;
        }
        Mat::create(top_blob,(int)(iVar1 * _w + iVar10 + -1) / iVar10,uVar17 * (uVar4 / uVar15),
                    iVar10,opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        memcpy(top_blob->data,bottom_blob->data,uVar4 * lVar20);
        break;
      case 2:
        uVar8 = (long)(int)(iVar1 * _h + iVar10 + -1) / (long)iVar10;
        sVar16 = (uVar4 / uVar15) * uVar17;
        uVar17 = sVar16 / uVar17;
        iVar14 = (int)uVar8;
        Mat::create(top_blob,_w,iVar14,sVar16,iVar10,opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        if (0 < iVar14) {
          uVar15 = 0;
          do {
            if (0 < (int)_w) {
              pvVar7 = top_blob->data;
              lVar9 = 0;
              do {
                uVar12 = (ulong)(uint)this->out_elempack;
                if (0 < this->out_elempack) {
                  lVar18 = 0;
                  do {
                    iVar10 = (int)uVar12 * (int)uVar15 + (int)lVar18;
                    iVar14 = iVar10 / iVar1;
                    if ((int)_h <= iVar14) break;
                    memcpy((void *)((long)pvVar7 +
                                   uVar17 * lVar18 + sVar16 * lVar9 + sVar16 * lVar20 * uVar15),
                           (void *)((long)bottom_blob->data +
                                   (long)(iVar10 % iVar1) * uVar17 + uVar4 * lVar9 +
                                   (long)iVar14 * lVar20 * uVar4),uVar17);
                    lVar18 = lVar18 + 1;
                    uVar12 = (ulong)this->out_elempack;
                  } while (lVar18 < (long)uVar12);
                }
                lVar9 = lVar9 + 1;
              } while (lVar9 != lVar20);
            }
            uVar15 = uVar15 + 1;
            if (uVar15 == (uVar8 & 0xffffffff)) {
              return 0;
            }
          } while( true );
        }
        break;
      case 3:
        uVar12 = (long)(iVar1 * iVar14 + iVar10 + -1) / (long)iVar10;
        sVar16 = (uVar4 / uVar15) * uVar17;
        uVar17 = sVar16 / uVar17;
        iVar13 = (int)uVar12;
        Mat::create(top_blob,_w,_h,iVar13,sVar16,iVar10,opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        if (0 < iVar13) {
          uVar15 = 0;
          do {
            if (0 < (int)_h) {
              sVar5 = top_blob->cstep;
              sVar6 = top_blob->elemsize;
              pvVar7 = top_blob->data;
              local_a8 = 0;
              do {
                if (0 < (int)_w) {
                  lVar9 = 0;
                  do {
                    uVar11 = (ulong)(uint)this->out_elempack;
                    if (0 < this->out_elempack) {
                      lVar18 = 0;
                      do {
                        iVar10 = (int)uVar11 * (int)uVar15 + (int)lVar18;
                        iVar13 = iVar10 / iVar1;
                        if (iVar14 <= iVar13) break;
                        memcpy((void *)((long)pvVar7 +
                                       uVar17 * lVar18 +
                                       sVar16 * lVar9 +
                                       local_a8 * lVar20 * sVar16 + sVar5 * uVar15 * sVar6),
                               (void *)((long)bottom_blob->data +
                                       (long)(iVar10 % iVar1) * uVar17 +
                                       uVar4 * lVar9 + local_a8 * lVar20 * uVar4 +
                                       (long)iVar13 * bottom_blob->cstep * bottom_blob->elemsize),
                               uVar17);
                        lVar18 = lVar18 + 1;
                        uVar11 = (ulong)this->out_elempack;
                      } while (lVar18 < (long)uVar11);
                    }
                    lVar9 = lVar9 + 1;
                  } while (lVar9 != lVar20);
                }
                local_a8 = local_a8 + 1;
              } while (local_a8 != uVar8);
            }
            uVar15 = uVar15 + 1;
            if (uVar15 == (uVar12 & 0xffffffff)) {
              return 0;
            }
          } while( true );
        }
        break;
      case 4:
        uVar12 = (long)(iVar14 * iVar1 + iVar10 + -1) / (long)iVar10;
        sVar16 = (uVar4 / uVar15) * uVar17;
        uVar17 = sVar16 / uVar17;
        iVar13 = (int)uVar12;
        Mat::create(top_blob,_w,_h,_d,iVar13,sVar16,iVar10,opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        if (0 < iVar13) {
          uVar15 = 0;
          do {
            if (0 < (int)_d) {
              sVar5 = top_blob->cstep;
              sVar6 = top_blob->elemsize;
              pvVar7 = top_blob->data;
              local_58 = 0;
              do {
                if (0 < (int)_h) {
                  local_a8 = 0;
                  do {
                    if (0 < (int)_w) {
                      lVar9 = (local_58 * uVar8 + local_a8) * lVar20;
                      lVar18 = 0;
                      do {
                        uVar11 = (ulong)(uint)this->out_elempack;
                        if (0 < this->out_elempack) {
                          lVar19 = 0;
                          do {
                            iVar10 = (int)uVar11 * (int)uVar15 + (int)lVar19;
                            iVar13 = iVar10 / iVar1;
                            if (iVar14 <= iVar13) break;
                            memcpy((void *)((long)pvVar7 +
                                           uVar17 * lVar19 +
                                           sVar16 * lVar18 + lVar9 * sVar16 + sVar5 * uVar15 * sVar6
                                           ),
                                   (void *)((long)bottom_blob->data +
                                           (long)(iVar10 % iVar1) * uVar17 +
                                           uVar4 * lVar18 + lVar9 * uVar4 +
                                           (long)iVar13 * bottom_blob->cstep * bottom_blob->elemsize
                                           ),uVar17);
                            lVar19 = lVar19 + 1;
                            uVar11 = (ulong)this->out_elempack;
                          } while (lVar19 < (long)uVar11);
                        }
                        lVar18 = lVar18 + 1;
                      } while (lVar18 != lVar20);
                    }
                    local_a8 = local_a8 + 1;
                  } while (local_a8 != uVar8);
                }
                local_58 = local_58 + 1;
              } while (local_58 != _d);
            }
            uVar15 = uVar15 + 1;
            if (uVar15 == (uVar12 & 0xffffffff)) {
              return 0;
            }
          } while( true );
        }
      }
      return 0;
    }
  }
  if (top_blob != bottom_blob) {
    piVar3 = bottom_blob->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = top_blob->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          if (top_blob->data != (void *)0x0) {
            free(top_blob->data);
          }
        }
        else {
          (*top_blob->allocator->_vptr_Allocator[3])();
        }
      }
    }
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
    *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    top_blob->c = 0;
    piVar3 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar3;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->elempack = bottom_blob->elempack;
    top_blob->allocator = bottom_blob->allocator;
    iVar1 = bottom_blob->w;
    iVar10 = bottom_blob->h;
    iVar14 = bottom_blob->d;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar1;
    top_blob->h = iVar10;
    top_blob->d = iVar14;
    top_blob->c = bottom_blob->c;
    top_blob->cstep = bottom_blob->cstep;
  }
  return 0;
}

Assistant:

int Packing::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elempack = bottom_blob.elempack;

    if (elempack == out_elempack)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    if (!use_padding)
    {
        // identity if use_padding not allowed
        if (dims == 1 && w * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
        if (dims == 2 && h * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
        if ((dims == 3 || dims == 4) && channels * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
    }

    if (dims == 1)
    {
        if (out_elempack == 1)
        {
            top_blob = bottom_blob;
            top_blob.w = w * elempack;
            top_blob.cstep = (size_t)w * elempack;
            top_blob.elemsize = elemsize / elempack;
            top_blob.elempack = out_elempack;
            return 0;
        }

        int outw = (w * elempack + out_elempack - 1) / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;

        top_blob.create(outw, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        memcpy(top_blob.data, bottom_blob.data, w * elemsize);

        return 0;
    }

    if (dims == 2)
    {
        int outh = (h * elempack + out_elempack - 1) / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;
        size_t lane_size = out_elemsize / out_elempack;

        top_blob.create(w, outh, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < outh; i++)
        {
            unsigned char* outptr = (unsigned char*)top_blob + (size_t)i * w * out_elemsize;

            for (int j = 0; j < w; j++)
            {
                unsigned char* out_elem_ptr = outptr + j * out_elemsize;

                for (int k = 0; k < out_elempack; k++)
                {
                    int srcy = (i * out_elempack + k) / elempack;
                    if (srcy >= h)
                        break;

                    int srck = (i * out_elempack + k) % elempack;

                    const unsigned char* ptr = (const unsigned char*)bottom_blob + (size_t)srcy * w * elemsize;
                    const unsigned char* elem_ptr = ptr + j * elemsize;

                    memcpy(out_elem_ptr + k * lane_size, elem_ptr + srck * lane_size, lane_size);
                }
            }
        }

        return 0;
    }

    if (dims == 3)
    {
        int outc = (channels * elempack + out_elempack - 1) / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;
        size_t lane_size = out_elemsize / out_elempack;

        top_blob.create(w, h, outc, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < outc; q++)
        {
            Mat out = top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                unsigned char* outptr = (unsigned char*)out + (size_t)i * w * out_elemsize;

                for (int j = 0; j < w; j++)
                {
                    unsigned char* out_elem_ptr = outptr + j * out_elemsize;

                    for (int k = 0; k < out_elempack; k++)
                    {
                        int srcq = (q * out_elempack + k) / elempack;
                        if (srcq >= channels)
                            break;

                        int srck = (q * out_elempack + k) % elempack;

                        const Mat m = bottom_blob.channel(srcq);
                        const unsigned char* ptr = (const unsigned char*)m + (size_t)i * w * elemsize;
                        const unsigned char* elem_ptr = ptr + j * elemsize;

                        memcpy(out_elem_ptr + k * lane_size, elem_ptr + srck * lane_size, lane_size);
                    }
                }
            }
        }

        return 0;
    }

    if (dims == 4)
    {
        int outc = (channels * elempack + out_elempack - 1) / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;
        size_t lane_size = out_elemsize / out_elempack;

        top_blob.create(w, h, d, outc, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < outc; q++)
        {
            Mat out = top_blob.channel(q);

            for (int z = 0; z < d; z++)
            {
                for (int i = 0; i < h; i++)
                {
                    unsigned char* outptr = (unsigned char*)out + (size_t)(z * h + i) * w * out_elemsize;

                    for (int j = 0; j < w; j++)
                    {
                        unsigned char* out_elem_ptr = outptr + j * out_elemsize;

                        for (int k = 0; k < out_elempack; k++)
                        {
                            int srcq = (q * out_elempack + k) / elempack;
                            if (srcq >= channels)
                                break;

                            int srck = (q * out_elempack + k) % elempack;

                            const Mat m = bottom_blob.channel(srcq);
                            const unsigned char* ptr = (const unsigned char*)m + (size_t)(z * h + i) * w * elemsize;
                            const unsigned char* elem_ptr = ptr + j * elemsize;

                            memcpy(out_elem_ptr + k * lane_size, elem_ptr + srck * lane_size, lane_size);
                        }
                    }
                }
            }
        }

        return 0;
    }

    return 0;
}